

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clocks.cc
# Opt level: O3

clock_id_t __thiscall
tchecker::clock_constraints_visitor_t::clock_id
          (clock_constraints_visitor_t *this,typed_expression_t *e)

{
  clock_id_t cVar1;
  typed_lvalue_expression_t *expr;
  range_t<unsigned_int,_unsigned_int> rVar2;
  invalid_argument *this_00;
  
  expr = (typed_lvalue_expression_t *)
         __dynamic_cast(e,&typed_expression_t::typeinfo,&typed_lvalue_expression_t::typeinfo,0);
  if (expr == (typed_lvalue_expression_t *)0x0) {
    __cxa_bad_cast();
  }
  rVar2 = extract_lvalue_variable_ids(expr);
  cVar1 = rVar2._begin;
  if (cVar1 == rVar2._end) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Cannot determine clock ID");
  }
  else {
    if (cVar1 + 1 == rVar2._end) {
      return cVar1;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Cannot determine clock ID");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

tchecker::clock_id_t clock_id(tchecker::typed_expression_t const & e)
  {
    tchecker::typed_lvalue_expression_t const & typed_e = dynamic_cast<tchecker::typed_lvalue_expression_t const &>(e);
    tchecker::range_t<tchecker::variable_id_t> ids_range = tchecker::extract_lvalue_variable_ids(typed_e);
    if (ids_range.empty())
      throw std::invalid_argument("Cannot determine clock ID");
    auto it = ids_range.begin();
    if (++it != ids_range.end())
      throw std::invalid_argument("Cannot determine clock ID");
    return ids_range.begin();
  }